

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O0

Error __thiscall
asmjit::v1_14::RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::handleBlockWithUnknownJump
          (RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *this,RABlock *block)

{
  uint uVar1;
  bool bVar2;
  Error EVar3;
  RABlock **ppRVar4;
  RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *in_RSI;
  long *in_RDI;
  RABlock *candidate;
  size_t i;
  RABlock *consecutive;
  size_t blockCount;
  RABlocks *blocks;
  RABlock *local_98;
  RABlock *successor;
  RABlock *this_00;
  RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *block_00;
  RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *this_01;
  
  uVar1 = *(uint *)(*in_RDI + 0xb8);
  block_00 = in_RSI;
  this_01 = in_RSI;
  bVar2 = Support::test<asmjit::v1_14::RABlockFlags,asmjit::v1_14::RABlockFlags>
                    (*(RABlockFlags *)((long)&in_RSI->_cc + 4),kHasConsecutive);
  if (bVar2) {
    ppRVar4 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[]
                        ((ZoneVector<asmjit::v1_14::RABlock_*> *)in_RSI,(size_t)in_RDI);
    local_98 = *ppRVar4;
  }
  else {
    local_98 = (RABlock *)0x0;
  }
  for (this_00 = (RABlock *)0x1; this_00 < (RABlock *)(ulong)uVar1; this_00 = this_00 + 1) {
    ppRVar4 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[]
                        ((ZoneVector<asmjit::v1_14::RABlock_*> *)in_RSI,(size_t)in_RDI);
    successor = *ppRVar4;
    if ((successor != local_98) &&
       (bVar2 = Support::test<asmjit::v1_14::RABlockFlags,asmjit::v1_14::RABlockFlags>
                          (*(RABlockFlags *)(successor + 0xc),kIsTargetable), bVar2)) {
      RABlock::appendSuccessor(this_00,successor);
    }
  }
  EVar3 = shareAssignmentAcrossSuccessors(this_01,(RABlock *)block_00);
  return EVar3;
}

Assistant:

Error handleBlockWithUnknownJump(RABlock* block) noexcept {
    RABlocks& blocks = _pass->blocks();
    size_t blockCount = blocks.size();

    // NOTE: Iterate from `1` as the first block is the entry block, we don't
    // allow the entry to be a successor of any block.
    RABlock* consecutive = block->consecutive();
    for (size_t i = 1; i < blockCount; i++) {
      RABlock* candidate = blocks[i];
      if (candidate == consecutive || !candidate->isTargetable())
        continue;
      block->appendSuccessor(candidate);
    }

    return shareAssignmentAcrossSuccessors(block);
  }